

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O2

bool tcu::intThresholdPositionDeviationErrorThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference
               ,ConstPixelBufferAccess *result,UVec4 *threshold,IVec3 *maxPositionDeviation,
               bool acceptOutOfBoundsAsAnyValue,int maxAllowedFailingPixels,CompareLogMode logMode)

{
  ostringstream *poVar1;
  int iVar2;
  TextureChannelClass TVar3;
  UVec4 *pUVar4;
  Vec4 *bias;
  ConstPixelBufferAccess *access;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  int __fd;
  LogImage *this;
  allocator<char> local_4a0;
  allocator<char> local_49f;
  allocator<char> local_49e;
  allocator<char> local_49d;
  allocator<char> local_49c;
  allocator<char> local_49b;
  allocator<char> local_49a;
  allocator<char> local_499;
  Vec4 local_498;
  Vec4 local_488;
  char *local_478;
  ConstPixelBufferAccess *local_470;
  char *local_468;
  string local_460;
  undefined1 local_440 [32];
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  LogImageSet local_360;
  PixelBufferAccess errorMask;
  TextureLevel errorMaskStorage;
  LogImage local_2d0;
  LogImage local_240;
  undefined1 local_1b0 [384];
  
  local_1b0._0_4_ = RGB;
  local_1b0._4_4_ = UNORM_INT8;
  local_478 = imageSetName;
  TextureLevel::TextureLevel
            (&errorMaskStorage,(TextureFormat *)local_1b0,(reference->m_size).m_data[0],
             (reference->m_size).m_data[1],(reference->m_size).m_data[2]);
  TextureLevel::getAccess(&errorMask,&errorMaskStorage);
  pUVar4 = threshold;
  iVar2 = anon_unknown_50::findNumPositionDeviationFailingPixels
                    (&errorMask,reference,result,threshold,maxPositionDeviation,
                     acceptOutOfBoundsAsAnyValue);
  bias = (Vec4 *)CONCAT71((int7)((ulong)pUVar4 >> 8),iVar2 <= maxAllowedFailingPixels);
  local_488.m_data[0] = 0.0;
  local_488.m_data[1] = 0.0;
  local_488.m_data[2] = 0.0;
  local_488.m_data[3] = 0.0;
  local_498.m_data[0] = 1.0;
  local_498.m_data[1] = 1.0;
  local_498.m_data[2] = 1.0;
  local_498.m_data[3] = 1.0;
  __fd = (int)log;
  if (logMode == COMPARE_LOG_EVERYTHING || maxAllowedFailingPixels < iVar2) {
    TVar3 = getTextureChannelClass((reference->m_format).type);
    if (TVar3 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      TVar3 = getTextureChannelClass((result->m_format).type);
      if (TVar3 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) goto LAB_01601515;
    }
    else {
LAB_01601515:
      bias = &local_488;
      anon_unknown_50::computeScaleAndBias(reference,result,&local_498,bias);
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_470 = result;
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "Result and reference images are normalized with formula p * ");
      operator<<((ostream *)poVar1,&local_498);
      std::operator<<((ostream *)poVar1," + ");
      operator<<((ostream *)poVar1,&local_488);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      result = local_470;
    }
    local_468 = imageSetDesc;
    if (maxAllowedFailingPixels < iVar2) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Image comparison failed:\n");
      std::operator<<((ostream *)poVar1,"\tallowed position deviation = ");
      operator<<((ostream *)poVar1,maxPositionDeviation);
      std::operator<<((ostream *)poVar1,"\n");
      std::operator<<((ostream *)poVar1,"\tcolor threshold = ");
      operator<<((ostream *)poVar1,threshold);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Number of failing pixels = ");
    std::ostream::operator<<(poVar1,iVar2);
    std::operator<<((ostream *)poVar1,", max allowed = ");
    std::ostream::operator<<(poVar1,maxAllowedFailingPixels);
    MessageBuilder::operator<<((MessageBuilder *)local_1b0,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_440,local_478,&local_499);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,local_468,&local_49a);
    LogImageSet::LogImageSet(&local_360,(string *)local_440,&local_460);
    LogImageSet::write(&local_360,__fd,__buf_01,(size_t)bias);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"Result",&local_49b);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"Result",&local_49c);
    LogImage::LogImage((LogImage *)local_1b0,&local_3c0,&local_3e0,result,&local_498,&local_488,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_1b0,__fd,__buf_02,(size_t)result);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_440 + 0x40),"Reference",&local_49d);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_440 + 0x20),"Reference",&local_49e);
    LogImage::LogImage(&local_240,(string *)(local_440 + 0x40),(string *)(local_440 + 0x20),
                       reference,&local_498,&local_488,QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write(&local_240,__fd,__buf_03,(size_t)reference);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"ErrorMask",&local_49f);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"Error mask",&local_4a0)
    ;
    access = &errorMask.super_ConstPixelBufferAccess;
    LogImage::LogImage(&local_2d0,&local_380,&local_3a0,access,QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write(&local_2d0,__fd,__buf_04,(size_t)access);
    TestLog::endImageSet(log);
    LogImage::~LogImage(&local_2d0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
    LogImage::~LogImage(&local_240);
    std::__cxx11::string::~string((string *)(local_440 + 0x20));
    std::__cxx11::string::~string((string *)(local_440 + 0x40));
    LogImage::~LogImage((LogImage *)local_1b0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3c0);
    LogImageSet::~LogImageSet(&local_360);
    std::__cxx11::string::~string((string *)&local_460);
    this = (LogImage *)local_440;
  }
  else {
    if (logMode != COMPARE_LOG_RESULT) goto LAB_016018e8;
    if (((result->m_format).order != RGBA) || ((result->m_format).type != UNORM_INT8)) {
      computePixelScaleBias(result,&local_498,&local_488);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,local_478,(allocator<char> *)&local_3c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,imageSetDesc,(allocator<char> *)&local_3e0);
    LogImageSet::LogImageSet((LogImageSet *)&local_240,&local_2d0.m_name,&local_360.m_name);
    LogImageSet::write((LogImageSet *)&local_240,__fd,__buf,(size_t)bias);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_440,"Result",(allocator<char> *)(local_440 + 0x40));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,"Result",(allocator<char> *)(local_440 + 0x20));
    LogImage::LogImage((LogImage *)local_1b0,(string *)local_440,&local_460,result,&local_498,
                       &local_488,QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_1b0,__fd,__buf_00,(size_t)result);
    TestLog::endImageSet(log);
    LogImage::~LogImage((LogImage *)local_1b0);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)local_440);
    LogImageSet::~LogImageSet((LogImageSet *)&local_240);
    std::__cxx11::string::~string((string *)&local_360);
    this = &local_2d0;
  }
  std::__cxx11::string::~string((string *)this);
LAB_016018e8:
  TextureLevel::~TextureLevel(&errorMaskStorage);
  return iVar2 <= maxAllowedFailingPixels;
}

Assistant:

bool intThresholdPositionDeviationErrorThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const UVec4& threshold, const tcu::IVec3& maxPositionDeviation, bool acceptOutOfBoundsAsAnyValue, int maxAllowedFailingPixels, CompareLogMode logMode)
{
	const int			width				= reference.getWidth();
	const int			height				= reference.getHeight();
	const int			depth				= reference.getDepth();
	TextureLevel		errorMaskStorage	(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), width, height, depth);
	PixelBufferAccess	errorMask			= errorMaskStorage.getAccess();
	const int			numFailingPixels	= findNumPositionDeviationFailingPixels(errorMask, reference, result, threshold, maxPositionDeviation, acceptOutOfBoundsAsAnyValue);
	const bool			compareOk			= numFailingPixels <= maxAllowedFailingPixels;
	Vec4				pixelBias			(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale			(1.0f, 1.0f, 1.0f, 1.0f);

	if (!compareOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// All formats except normalized unsigned fixed point ones need remapping in order to fit into unorm channels in logged images.
		if (tcu::getTextureChannelClass(reference.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT ||
			tcu::getTextureChannelClass(result.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
		{
			computeScaleAndBias(reference, result, pixelScale, pixelBias);
			log << TestLog::Message << "Result and reference images are normalized with formula p * " << pixelScale << " + " << pixelBias << TestLog::EndMessage;
		}

		if (!compareOk)
			log	<< TestLog::Message
				<< "Image comparison failed:\n"
				<< "\tallowed position deviation = " << maxPositionDeviation << "\n"
				<< "\tcolor threshold = " << threshold
				<< TestLog::EndMessage;
		log << TestLog::Message << "Number of failing pixels = " << numFailingPixels << ", max allowed = " << maxAllowedFailingPixels << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",	reference,	pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return compareOk;
}